

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::UpdateTxOutAmount(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateTxOutAmountRequestStruct_&)>
  local_58;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateTxOutAmountRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::UpdateTxOutAmountRequestStruct_const&)>
  ::
  function<cfd::js::api::RawTransactionResponseStruct(&)(cfd::js::api::UpdateTxOutAmountRequestStruct_const&),void>
            ((function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::UpdateTxOutAmountRequestStruct_const&)>
              *)&local_38,TransactionStructApi::UpdateTxOutAmount);
  std::
  function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::UpdateTxOutAmountRequestStruct_const&)>
  ::
  function<cfd::js::api::RawTransactionResponseStruct(&)(cfd::js::api::UpdateTxOutAmountRequestStruct_const&),void>
            ((function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::UpdateTxOutAmountRequestStruct_const&)>
              *)&local_58,ElementsTransactionStructApi::UpdateTxOutAmount);
  ExecuteElementsCheckApi<cfd::js::api::json::UpdateTxOutAmountRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::UpdateTxOutAmountRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            ((json *)this,request_message,&local_38,&local_58);
  std::
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateTxOutAmountRequestStruct_&)>
  ::~function(&local_58);
  std::
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateTxOutAmountRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::UpdateTxOutAmount(
    const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::UpdateTxOutAmountRequest, api::json::RawTransactionResponse,
      api::UpdateTxOutAmountRequestStruct, api::RawTransactionResponseStruct>(
      request_message, TransactionStructApi::UpdateTxOutAmount,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsTransactionStructApi::UpdateTxOutAmount);
#else
      TransactionStructApi::UpdateTxOutAmount);
#endif
}